

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_exact_sqrt(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  sexp_gc_var_t *psVar1;
  undefined1 auVar2 [16];
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp rem;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_ffffffffffffffa8;
  sexp head;
  sexp_gc_var_t *n_00;
  sexp psVar3;
  undefined8 ctx_00;
  undefined8 local_28;
  undefined8 uVar4;
  
  local_28 = 0x43e;
  memset(&stack0xffffffffffffffc8,0,0x10);
  psVar3 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffb0,0,0x10);
  ctx_00 = &stack0xffffffffffffffd8;
  psVar1 = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc8;
  head = (sexp)&stack0xffffffffffffffc0;
  n_00 = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb0;
  if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xc)) {
    local_28 = sexp_bignum_sqrt(rem,(sexp)__sexp_gc_preserver2.next,__sexp_gc_preserver2.var);
    local_28 = sexp_cons_op((sexp)ctx_00,psVar3,(sexp_sint_t)n_00,head,in_stack_ffffffffffffffa8);
    goto LAB_0014c38d;
  }
  local_28 = sexp_inexact_sqrt((sexp)in_RDI,(sexp)in_RSI,in_RDX,(sexp)in_RCX);
  if (((local_28 & 3) == 0) && (((sexp)local_28)->tag == 0xb)) {
    uVar4 = in_RDI;
    trunc((((sexp)local_28)->value).flonum);
    sexp_double_to_bignum((sexp)__sexp_gc_preserver2.next,(double)__sexp_gc_preserver2.var);
    local_28 = sexp_bignum_normalize((sexp)in_RDI);
    in_stack_ffffffffffffffa8 = (sexp)in_RDI;
    in_RDI = uVar4;
  }
  if (((local_28 & 3) == 0) && (((sexp)local_28)->tag == 0x13)) goto LAB_0014c38d;
  sexp_mul((sexp)n,z,res);
  psVar3 = sexp_sub(ctx,self,(sexp)n);
  if (((ulong)psVar3 & 1) == 1) {
    auVar2._8_8_ = (long)psVar3 >> 0x3f;
    auVar2._0_8_ = (ulong)psVar3 & 0xfffffffffffffffe;
    if (SUB168(auVar2 / SEXT816(2),0) < 0) goto LAB_0014c31e;
LAB_0014c2f6:
    if (((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0xb)) &&
       ((psVar3->value).flonum <= 0.0 && (psVar3->value).flonum != 0.0)) goto LAB_0014c31e;
  }
  else {
    if (((((ulong)psVar3 & 3) != 0) || (psVar3->tag != 0xc)) ||
       (-1 < (psVar3->value).flonum_bits[0])) goto LAB_0014c2f6;
LAB_0014c31e:
    local_28 = sexp_sub(ctx,self,(sexp)n);
    sexp_mul((sexp)n,z,res);
    psVar3 = sexp_sub(ctx,self,(sexp)n);
  }
  local_28 = sexp_cons_op((sexp)ctx_00,psVar3,(sexp_sint_t)n_00,head,in_stack_ffffffffffffffa8);
LAB_0014c38d:
  (((sexp)in_RDI)->value).context.saves = psVar1;
  return (sexp)local_28;
}

Assistant:

sexp sexp_exact_sqrt (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  sexp_gc_var2(res, rem);
  sexp_gc_preserve2(ctx, res, rem);
  if (sexp_bignump(z)) {
    res = sexp_bignum_sqrt(ctx, z, &rem);
    res = sexp_cons(ctx, res, rem);
  } else {
    res = sexp_inexact_sqrt(ctx, self, n, z);
    if (sexp_flonump(res)) {
      res = sexp_bignum_normalize(sexp_double_to_bignum(ctx, trunc(sexp_flonum_value(res))));
    }
    if (!sexp_exceptionp(res)) {
      rem = sexp_mul(ctx, res, res);
      rem = sexp_sub(ctx, z, rem);
      if (sexp_negativep(rem)) {
        res = sexp_sub(ctx, res, SEXP_ONE);
        rem = sexp_mul(ctx, res, res);
        rem = sexp_sub(ctx, z, rem);
      }
      res = sexp_cons(ctx, res, rem);
    }
  }
  sexp_gc_release2(ctx);
  return res;
}